

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O3

void IT8951HostAreaPackedPixelWrite(IT8951LdImgInfo *pstLdImgInfo,IT8951AreaImgInfo *pstAreaImgInfo)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint16_t *puVar5;
  
  puVar5 = (uint16_t *)(ulong)pstLdImgInfo->ulStartFBAddr;
  IT8951SetImgBufBaseAddr(pstLdImgInfo->ulImgBufBaseAddr);
  IT8951LoadImgAreaStart(pstLdImgInfo,pstAreaImgInfo);
  uVar2 = pstAreaImgInfo->usHeight;
  if (uVar2 != 0) {
    uVar1 = pstAreaImgInfo->usWidth;
    uVar3 = 0;
    do {
      if (1 < uVar1) {
        uVar4 = 0;
        do {
          LCDWriteData(*puVar5);
          puVar5 = puVar5 + 1;
          uVar4 = uVar4 + 1;
          uVar1 = pstAreaImgInfo->usWidth;
        } while (uVar4 < uVar1 >> 1);
        uVar2 = pstAreaImgInfo->usHeight;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  LCDWriteCmdCode(0x22);
  return;
}

Assistant:

void IT8951HostAreaPackedPixelWrite(IT8951LdImgInfo* pstLdImgInfo,IT8951AreaImgInfo* pstAreaImgInfo)
{
	uint32_t i,j;
	//Source buffer address of Host
	uint16_t* pusFrameBuf = (uint16_t*)pstLdImgInfo->ulStartFBAddr;

	//Set Image buffer(IT8951) Base address
	IT8951SetImgBufBaseAddr(pstLdImgInfo->ulImgBufBaseAddr);
	//Send Load Image start Cmd
	IT8951LoadImgAreaStart(pstLdImgInfo , pstAreaImgInfo);
	//Host Write Data
	for(j=0;j< pstAreaImgInfo->usHeight;j++)
	{
		 for(i=0;i< pstAreaImgInfo->usWidth/2;i++)
			{
					//Write a Word(2-Bytes) for each time
					LCDWriteData(*pusFrameBuf);
					pusFrameBuf++;
			}
	}
	//Send Load Img End Command
	IT8951LoadImgEnd();
}